

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::TerminatedEvent>::copyConstruct
          (BasicTypeInfo<dap::TerminatedEvent> *this,void *dst,void *src)

{
  long *plVar1;
  uintptr_t addr;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  
  *(undefined8 *)dst = 0;
  plVar1 = *(long **)((long)src + 8);
  *(long **)((long)dst + 8) = plVar1;
  *(undefined8 *)((long)dst + 0x10) = 0;
  if (*src != 0) {
    lVar2 = (**(code **)(*plVar1 + 0x18))();
    uVar3 = (**(code **)(**(long **)((long)dst + 8) + 0x20))();
    if (*dst != 0) {
      __assert_fail("value == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xb9,"void dap::any::alloc(size_t, size_t)");
    }
    uVar5 = (long)dst + uVar3 + 0x17;
    lVar6 = uVar5 - uVar5 % uVar3;
    *(long *)dst = lVar6;
    uVar5 = (lVar6 + lVar2) - 1;
    if (uVar5 < (long)dst + 0x18U || (long)dst + 0x38U <= uVar5) {
      pvVar4 = operator_new__(lVar2 + uVar3);
      *(void **)((long)dst + 0x10) = pvVar4;
      uVar5 = (uVar3 - 1) + (long)pvVar4;
      *(ulong *)dst = uVar5 - uVar5 % uVar3;
    }
    (**(code **)(**(long **)((long)dst + 8) + 0x30))(*(long **)((long)dst + 8),*dst,*src);
  }
  *(undefined1 *)((long)dst + 0x38) = *(undefined1 *)((long)src + 0x38);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }